

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O3

string * __thiscall
minja::Parser::consumeToken
          (string *__return_storage_ptr__,Parser *this,string *token,SpaceHandling space_handling)

{
  char *pcVar1;
  char *pcVar2;
  size_type sVar3;
  pointer pcVar4;
  long *plVar5;
  int iVar6;
  bool bVar7;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  pcVar1 = (this->it)._M_current;
  consumeSpaces(this,space_handling);
  pcVar2 = (this->it)._M_current;
  if ((long)token->_M_string_length <= (long)(this->end)._M_current - (long)pcVar2) {
    local_50 = local_40;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)&local_50,pcVar2,pcVar2 + token->_M_string_length);
    plVar5 = local_50;
    if (local_48 == token->_M_string_length) {
      if (local_48 == 0) {
        bVar7 = true;
      }
      else {
        iVar6 = bcmp(local_50,(token->_M_dataplus)._M_p,local_48);
        bVar7 = iVar6 == 0;
      }
    }
    else {
      bVar7 = false;
    }
    if (plVar5 != local_40) {
      operator_delete(plVar5,local_40[0] + 1);
    }
    if (bVar7) {
      sVar3 = token->_M_string_length;
      (this->it)._M_current = (this->it)._M_current + sVar3;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = (token->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar4,pcVar4 + sVar3);
      return __return_storage_ptr__;
    }
  }
  (this->it)._M_current = pcVar1;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string consumeToken(const std::string & token, SpaceHandling space_handling = SpaceHandling::Strip) {
        auto start = it;
        consumeSpaces(space_handling);
        if (std::distance(it, end) >= (int64_t) token.size() && std::string(it, it + token.size()) == token) {
            it += token.size();
            return token;
        }
        it = start;
        return "";
    }